

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O3

OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> * __thiscall
llvm::optional_detail::
OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>::operator=
          (OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *y)

{
  if (this->hasVal == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,y);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,y);
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(const T &y) {
    if (hasVal)
      *getPointer() = y;
    else {
      new (storage.buffer) T(y);
      hasVal = true;
    }
    return *this;
  }